

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O2

void address_space_stb_x86_64
               (uc_struct_conflict *uc,AddressSpace *as,hwaddr addr,uint32_t val,MemTxAttrs attrs,
               MemTxResult *result)

{
  MemTxResult MVar1;
  MemoryRegion *mr;
  undefined1 *puVar2;
  hwaddr addr1;
  hwaddr l;
  
  l = 1;
  mr = address_space_translate(as,addr,&addr1,&l,true,attrs);
  if ((mr->ram == true) && (mr->readonly != true)) {
    puVar2 = (undefined1 *)qemu_map_ram_ptr_x86_64((uc_struct_conflict *)mr->uc,mr->ram_block,addr1)
    ;
    *puVar2 = (char)val;
    MVar1 = 0;
  }
  else {
    MVar1 = memory_region_dispatch_write_x86_64(uc,mr,addr1,(ulong)val,MO_8,attrs);
  }
  if (result != (MemTxResult *)0x0) {
    *result = MVar1;
  }
  return;
}

Assistant:

void glue(address_space_stb, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, uint32_t val, MemTxAttrs attrs, MemTxResult *result)
{
    uint8_t *ptr;
    MemoryRegion *mr;
    hwaddr l = 1;
    hwaddr addr1;
    MemTxResult r;
    bool release_lock = false;

    //RCU_READ_LOCK();
    mr = TRANSLATE(addr, &addr1, &l, true, attrs);
    if (!memory_access_is_direct(mr, true)) {
        release_lock |= prepare_mmio_access(mr);
        r = memory_region_dispatch_write(uc, mr, addr1, val, MO_8, attrs);
    } else {
        /* RAM case */
        ptr = qemu_map_ram_ptr(mr->uc, mr->ram_block, addr1);
        stb_p(ptr, val);
        invalidate_and_set_dirty(mr, addr1, 1);
        r = MEMTX_OK;
    }
    if (result) {
        *result = r;
    }
    //RCU_READ_UNLOCK();
}